

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O1

void __thiscall
amrex::MLMG::apply(MLMG *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *out,
                  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_in)

{
  undefined8 uVar1;
  _func_int **pp_Var2;
  MLLinOp *pMVar3;
  pointer ppMVar4;
  MLLinOp *pMVar5;
  bool bVar6;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *pVVar7;
  int nghost;
  int iVar8;
  MultiFab *pMVar9;
  long *plVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  IntVect ng;
  IntVect ng_sol;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> in;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> rh;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> in_raii;
  long *local_230;
  int local_228;
  undefined8 local_220;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> local_208;
  vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> local_1f0;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_1d8;
  vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> local_1d0;
  undefined1 local_1b8 [392];
  
  std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            (&local_208,(long)this->namrlevs,(allocator_type *)local_1b8);
  std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::vector
            (&local_1d0,(long)this->namrlevs,(allocator_type *)local_1b8);
  std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::vector
            (&local_1f0,(long)this->namrlevs,(allocator_type *)local_1b8);
  local_220 = (long *)0x100000001;
  local_218 = 1;
  uVar13 = (ulong)(uint)(this->linop->info).hidden_direction;
  if (uVar13 < 3) {
    *(undefined4 *)((long)&local_220 + uVar13 * 4) = 0;
  }
  local_1d8 = out;
  if (this->namrlevs < 1) {
    nghost = 0;
  }
  else {
    local_20c = (int)local_220;
    local_210 = local_220._4_4_;
    local_214 = local_218;
    lVar12 = 0;
    lVar11 = 0;
    uVar13 = 0;
    nghost = 0;
    do {
      if (this->cf_strategy == ghostnodes) {
        nghost = (*this->linop->_vptr_MLLinOp[6])(this->linop,uVar13 & 0xffffffff,0);
        pMVar9 = (a_in->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                 super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar13];
LAB_0064f6d8:
        local_208.super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar13] = pMVar9;
      }
      else {
        ppMVar4 = (a_in->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pMVar9 = ppMVar4[uVar13];
        uVar1 = *(undefined8 *)
                 (pMVar9->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect;
        if (((local_20c != (int)uVar1) || (local_210 != (int)((ulong)uVar1 >> 0x20))) ||
           ((pMVar9->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[2] !=
            local_214)) {
          local_228 = local_218;
          local_230 = local_220;
          pMVar9 = ppMVar4[uVar13];
          local_1b8._0_8_ = (_func_int **)0x1;
          local_1b8._24_8_ = 0;
          local_1b8._32_8_ = 0;
          local_1b8._8_8_ = 0;
          local_1b8._16_8_ = 0;
          (**(code **)(*(long *)((long)&((local_1d0.
                                          super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                                        _vptr_FabArrayBase + lVar11) + 0x18))
                    ((long)&((local_1d0.
                              super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                              _M_impl.super__Vector_impl_data._M_start)->
                            super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase
                     + lVar11,&(pMVar9->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                               boxarray,
                     &(pMVar9->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,
                     (pMVar9->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,&local_230
                     ,local_1b8,
                     **(undefined8 **)
                       ((long)&(((this->linop->m_factory).
                                 super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                                 .
                                 super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                               ).
                               super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar12));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_1b8 + 0x10));
          pMVar9 = (a_in->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                   super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl
                   .super__Vector_impl_data._M_start[uVar13];
          MultiFab::Copy((MultiFab *)
                         ((long)&((local_1d0.
                                   super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                                 _vptr_FabArrayBase + lVar11),pMVar9,0,0,
                         (pMVar9->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,nghost
                        );
          pMVar9 = (MultiFab *)
                   ((long)&((local_1d0.
                             super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                             _M_impl.super__Vector_impl_data._M_start)->
                           super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase +
                   lVar11);
          goto LAB_0064f6d8;
        }
        local_208.super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar13] = pMVar9;
      }
      pMVar9 = (a_in->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
               super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar13];
      local_1b8._0_8_ = (_func_int **)0x1;
      local_1b8._24_8_ = 0;
      local_1b8._32_8_ = 0;
      local_1b8._8_8_ = 0;
      local_1b8._16_8_ = 0;
      (**(code **)(*(long *)((long)&((local_1f0.
                                      super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                                    _vptr_FabArrayBase + lVar11) + 0x10))
                ((long)&((local_1f0.
                          super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                          _M_impl.super__Vector_impl_data._M_start)->
                        super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase +
                 lVar11,&(pMVar9->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
                 &(pMVar9->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,
                 (pMVar9->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,nghost,
                 local_1b8,
                 **(undefined8 **)
                   ((long)&(((this->linop->m_factory).
                             super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                             .
                             super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                           ).
                           super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar12));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1b8 + 0x10));
      FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 ((long)&((local_1f0.
                           super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                           _M_impl.super__Vector_impl_data._M_start)->
                         super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase +
                 lVar11),0.0,0,
                 *(int *)((long)(&((local_1f0.
                                    super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow + 1) +
                         lVar11),
                 (IntVect *)
                 ((long)((local_1f0.
                          super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                          _M_impl.super__Vector_impl_data._M_start)->
                        super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect + lVar11));
      uVar13 = uVar13 + 1;
      lVar11 = lVar11 + 0x180;
      lVar12 = lVar12 + 0x18;
    } while ((long)uVar13 < (long)this->namrlevs);
  }
  pp_Var2 = this->linop->_vptr_MLLinOp;
  if (this->linop_prepared == false) {
    (*pp_Var2[0x1d])();
    this->linop_prepared = true;
  }
  else {
    iVar8 = (*pp_Var2[7])();
    if ((char)iVar8 != '\0') {
      (*this->linop->_vptr_MLLinOp[8])();
    }
  }
  if (0 < this->namrlevs) {
    lVar11 = 0;
    uVar13 = 0;
    do {
      MultiFab::MultiFab((MultiFab *)local_1b8,
                         (MultiFab *)
                         ((long)&((local_1f0.
                                   super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                                 _vptr_FabArrayBase + lVar11),make_alias,0,
                         *(int *)((long)(&((local_1f0.
                                            super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                                          n_grow + 1) + lVar11));
      plVar10 = (long *)operator_new(0x188);
      *plVar10 = (long)&PTR_Type_0083a370;
      MultiFab::MultiFab((MultiFab *)(plVar10 + 1),(MultiFab *)local_1b8);
      local_230 = plVar10;
      MultiFab::~MultiFab((MultiFab *)local_1b8);
      (*this->linop->_vptr_MLLinOp[0x18])(this->linop,uVar13 & 0xffffffff,&local_230);
      if (local_230 != (long *)0x0) {
        (**(code **)(*local_230 + 0x10))();
      }
      uVar13 = uVar13 + 1;
      lVar11 = lVar11 + 0x180;
    } while ((long)uVar13 < (long)this->namrlevs);
  }
  pVVar7 = local_1d8;
  lVar11 = (long)this->finest_amr_lev;
  if (-1 < lVar11) {
    pMVar3 = this->linop;
    lVar12 = lVar11 * 0x180;
    lVar11 = lVar11 + 1;
    do {
      if (lVar11 == 1) {
        pMVar9 = (MultiFab *)0x0;
      }
      else {
        pMVar9 = local_208.super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar11 + -2];
      }
      (*this->linop->_vptr_MLLinOp[0x10])
                (this->linop,(ulong)((int)lVar11 - 1),
                 (pVVar7->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                 super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar11 + -1],
                 local_208.super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar11 + -1],
                 (long)&((local_1f0.
                          super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                          _M_impl.super__Vector_impl_data._M_start)->
                        super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase +
                 lVar12,pMVar9);
      if (lVar11 + -1 < (long)this->finest_amr_lev) {
        ppMVar4 = (pVVar7->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        (*this->linop->_vptr_MLLinOp[0x12])
                  (this->linop,(ulong)((int)lVar11 - 1),ppMVar4[lVar11 + -1],
                   local_208.
                   super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl
                   .super__Vector_impl_data._M_start[lVar11 + -1],
                   (long)&((local_1f0.
                            super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                            _M_impl.super__Vector_impl_data._M_start)->
                          super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase +
                   lVar12,ppMVar4[lVar11],
                   local_208.
                   super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl
                   .super__Vector_impl_data._M_start[lVar11],
                   (long)&local_1f0.
                          super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                          _M_impl.super__Vector_impl_data._M_start[1].
                          super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase +
                   lVar12);
        pMVar5 = this->linop;
        if (((pMVar5->m_ixtype).vect[1] == 0 && (pMVar5->m_ixtype).vect[0] == 0) &&
           ((pMVar5->m_ixtype).vect[2] == 0)) {
          ppMVar4 = (pVVar7->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pMVar9 = ppMVar4[lVar11 + -1];
          EB_average_down(ppMVar4[lVar11],pMVar9,0,
                          (pMVar9->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,
                          (pMVar3->m_amr_ref_ratio).super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar11 + -1]);
        }
      }
      lVar12 = lVar12 + -0x180;
      lVar14 = lVar11 + -1;
      bVar6 = 0 < lVar11;
      lVar11 = lVar14;
    } while (lVar14 != 0 && bVar6);
  }
  if (-1 < this->finest_amr_lev) {
    uVar13 = 0;
    do {
      if (this->cf_strategy == ghostnodes) {
        nghost = (*this->linop->_vptr_MLLinOp[6])(this->linop,uVar13 & 0xffffffff,0);
      }
      MultiFab::negate((pVVar7->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>)
                       .super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar13],nghost);
      bVar6 = (long)uVar13 < (long)this->finest_amr_lev;
      uVar13 = uVar13 + 1;
    } while (bVar6);
  }
  std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::~vector(&local_1f0);
  std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::~vector(&local_1d0);
  if (local_208.super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
MLMG::apply (const Vector<MultiFab*>& out, const Vector<MultiFab*>& a_in)
{
    BL_PROFILE("MLMG::apply()");

    Vector<MultiFab*> in(namrlevs);
    Vector<MultiFab> in_raii(namrlevs);
    Vector<MultiFab> rh(namrlevs);
    int nghost = 0;
    IntVect ng_sol(1);
    if (linop.hasHiddenDimension()) ng_sol[linop.hiddenDirection()] = 0;

    for (int alev = 0; alev < namrlevs; ++alev)
    {
        if (cf_strategy == CFStrategy::ghostnodes)
        {
            nghost = linop.getNGrow(alev);
            in[alev] = a_in[alev];
        }
        else if (a_in[alev]->nGrowVect() == ng_sol)
        {
            in[alev] = a_in[alev];
        }
        else
        {
            IntVect ng = ng_sol;
            if (cf_strategy == CFStrategy::ghostnodes) ng = IntVect(nghost);
            in_raii[alev].define(a_in[alev]->boxArray(),
                                 a_in[alev]->DistributionMap(),
                                 a_in[alev]->nComp(), ng,
                                 MFInfo(), *linop.Factory(alev));
            MultiFab::Copy(in_raii[alev], *a_in[alev], 0, 0, a_in[alev]->nComp(), nghost);
            in[alev] = &(in_raii[alev]);
        }
        rh[alev].define(a_in[alev]->boxArray(),
                        a_in[alev]->DistributionMap(),
                        a_in[alev]->nComp(), nghost, MFInfo(),
                        *linop.Factory(alev));
        rh[alev].setVal(0.0);
    }

    if (!linop_prepared) {
        linop.prepareForSolve();
        linop_prepared = true;
    } else if (linop.needsUpdate()) {
        linop.update();
    }

    for (int alev = 0; alev < namrlevs; ++alev) {
        Any a(MultiFab(rh[alev], amrex::make_alias, 0, rh[alev].nComp()));
        linop.applyInhomogNeumannTerm(alev, a);
    }

    const auto& amrrr = linop.AMRRefRatio();

    for (int alev = finest_amr_lev; alev >= 0; --alev) {
        const MultiFab* crse_bcdata = (alev > 0) ? in[alev-1] : nullptr;
        linop.solutionResidual(alev, *out[alev], *in[alev], rh[alev], crse_bcdata);
        if (alev < finest_amr_lev) {
            linop.reflux(alev, *out[alev], *in[alev], rh[alev],
                         *out[alev+1], *in[alev+1], rh[alev+1]);
            if (linop.isCellCentered()) {
#ifdef AMREX_USE_EB
                amrex::EB_average_down(*out[alev+1], *out[alev], 0, out[alev]->nComp(), amrrr[alev]);
#else
                amrex::average_down(*out[alev+1], *out[alev], 0, out[alev]->nComp(), amrrr[alev]);
#endif
            }
        }
    }

#if (AMREX_SPACEDIM != 3)
    for (int alev = 0; alev <= finest_amr_lev; ++alev) {
        linop.unapplyMetricTerm(alev, 0, *out[alev]);
    }
#endif

    for (int alev = 0; alev <= finest_amr_lev; ++alev) {
        if (cf_strategy == CFStrategy::ghostnodes)  nghost = linop.getNGrow(alev);
        out[alev]->negate(nghost);
    }
}